

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yangdata.c
# Opt level: O2

void remove_iffeature_type(lys_type *type,ly_ctx *ctx)

{
  lys_type_bit *plVar1;
  ulong uVar2;
  long lVar3;
  
  if (type->base == LY_TYPE_ENUM) {
    lVar3 = 0x1b;
    for (uVar2 = 0; uVar2 < (type->info).bits.count; uVar2 = uVar2 + 1) {
      plVar1 = (type->info).bits.bit;
      remove_iffeature((lys_iffeature **)((long)&plVar1->dsc + lVar3 + 5),
                       (uint8_t *)((long)&plVar1->name + lVar3),ctx);
      lVar3 = lVar3 + 0x30;
    }
  }
  else if (type->base == LY_TYPE_BITS) {
    lVar3 = 0x1b;
    for (uVar2 = 0; uVar2 < (type->info).bits.count; uVar2 = uVar2 + 1) {
      plVar1 = (type->info).bits.bit;
      remove_iffeature((lys_iffeature **)((long)&plVar1->dsc + lVar3 + 5),
                       (uint8_t *)((long)&plVar1->name + lVar3),ctx);
      lVar3 = lVar3 + 0x30;
    }
  }
  return;
}

Assistant:

void remove_iffeature_type(struct lys_type *type, struct ly_ctx *ctx) {
    unsigned int i;

    if (type->base == LY_TYPE_ENUM) {
        for (i = 0; i < type->info.enums.count; ++i) {
            remove_iffeature(&type->info.enums.enm[i].iffeature, &type->info.enums.enm[i].iffeature_size, ctx);
        }
    } else if (type->base == LY_TYPE_BITS) {
        for (i = 0; i < type->info.bits.count; ++i) {
            remove_iffeature(&type->info.bits.bit[i].iffeature, &type->info.bits.bit[i].iffeature_size, ctx);
        }
    }
}